

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

pair<unsigned_int,_unsigned_int>
anon_unknown.dwarf_1af079::LaneBasedExecutionQueue::estimateTaskLimits(uint numLanes)

{
  type_conflict tVar1;
  unsigned_long *puVar2;
  uint *puVar3;
  size_t local_a8;
  byte local_91;
  uint local_90 [2];
  StringRef local_88;
  char *local_78;
  char *p;
  uint backgroundTaskMax;
  uint extraTasksMax;
  uint local_5c;
  uint local_58 [2];
  uint maxConcurrentTasks;
  uint filesPerTask;
  uint local_48;
  int local_44;
  uint allowedFilesForTasks;
  pair<int,_int> local_3c;
  undefined4 local_34;
  llbuild_rlim_t lStack_30;
  uint reservedFileCount;
  llbuild_rlim_t curOpenFileLimit;
  pair<unsigned_int,_unsigned_int> pStack_20;
  uint numLanes_local;
  char *local_18;
  StringRef *local_10;
  
  curOpenFileLimit._4_4_ = numLanes;
  lStack_30 = llbuild::basic::sys::getOpenFileLimit();
  local_34 = 10;
  if (lStack_30 < 10) {
    if (9 < lStack_30) {
      __assert_fail("curOpenFileLimit < reservedFileCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp"
                    ,0x132,
                    "static std::pair<unsigned int, unsigned int> (anonymous namespace)::LaneBasedExecutionQueue::estimateTaskLimits(unsigned int)"
                   );
    }
    allowedFilesForTasks = 1;
    local_44 = 0;
    local_3c = std::make_pair<int,int>((int *)&allowedFilesForTasks,&local_44);
    std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&stack0xffffffffffffffe0,&local_3c);
  }
  else {
    _maxConcurrentTasks = 0x7fffffff;
    puVar2 = std::min<unsigned_long>(&stack0xffffffffffffffd0,(unsigned_long *)&maxConcurrentTasks);
    local_48 = (int)*puVar2 - 10;
    local_58[1] = 2;
    local_58[0] = local_48 / 2;
    if (local_58[0] < curOpenFileLimit._4_4_) {
      local_5c = 1;
      puVar3 = std::max<unsigned_int>(&local_5c,local_58);
      curOpenFileLimit._4_4_ = *puVar3;
      backgroundTaskMax = 0;
      _extraTasksMax =
           std::make_pair<unsigned_int&,int>
                     ((uint *)((long)&curOpenFileLimit + 4),(int *)&backgroundTaskMax);
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>
                (&stack0xffffffffffffffe0,(pair<unsigned_int,_int> *)&extraTasksMax);
    }
    else {
      p._4_4_ = local_58[0] - curOpenFileLimit._4_4_;
      p._0_4_ = 0;
      local_78 = getenv("LLBUILD_BACKGROUND_TASK_MAX");
      local_91 = 0;
      if (local_78 != (char *)0x0) {
        local_10 = &local_88;
        local_18 = local_78;
        local_88.Data = local_78;
        if (local_78 == (char *)0x0) {
          local_a8 = 0;
        }
        else {
          local_a8 = strlen(local_78);
        }
        local_88.Length = local_a8;
        tVar1 = llvm::StringRef::getAsInteger<unsigned_int>(&local_88,10,(uint *)&p);
        local_91 = tVar1 ^ 0xff;
      }
      if ((local_91 & 1) == 0) {
        local_90[1] = 0x400;
        local_90[0] = curOpenFileLimit._4_4_ << 6;
        puVar3 = std::min<unsigned_int>(local_90 + 1,local_90);
        p._0_4_ = *puVar3;
      }
      puVar3 = std::min<unsigned_int>((uint *)&p,(uint *)((long)&p + 4));
      p._0_4_ = *puVar3;
      pStack_20 = std::make_pair<unsigned_int&,unsigned_int&>
                            ((uint *)((long)&curOpenFileLimit + 4),(uint *)&p);
    }
  }
  return pStack_20;
}

Assistant:

static auto estimateTaskLimits(unsigned numLanes) -> std::pair<unsigned, unsigned> {
    llbuild_rlim_t curOpenFileLimit = llbuild::basic::sys::getOpenFileLimit();
    const unsigned reservedFileCount =   3 /* stdin, stdout, stderr */
                                       + 2 /* Database */
                                       + 1 /* Logging */
                                       + 2 /* Additional fds during spawn */
                                       + 2 /* Fudge factor */;
    if (curOpenFileLimit < reservedFileCount) {
      assert(curOpenFileLimit < reservedFileCount);
      // Certainly can't afford background tasks.
      // Maybe even can't afford building altogether, but let's risk it.
      return std::make_pair(1, 0);
    }

    unsigned allowedFilesForTasks = static_cast<unsigned>(std::min(curOpenFileLimit, static_cast<llbuild_rlim_t>(INT_MAX))) - reservedFileCount;
    unsigned filesPerTask = 2;  // A task has output [and control] file descriptors.
    unsigned maxConcurrentTasks = allowedFilesForTasks / filesPerTask;

    if (numLanes > maxConcurrentTasks) {
      // Can't afford background tasks, and maybe won't even support
      // the full extent of requested concurrency.
      numLanes = std::max(1u, maxConcurrentTasks);
      return std::make_pair(numLanes, 0);
    }

    // Number of tasks that can be run, according to open file limits.
    unsigned extraTasksMax = maxConcurrentTasks - numLanes;

    // Configure the background task maximum. We currently support an
    // environmental override for experimentation purposes, but otherwise
    // limit to a modest multiple of the core count, since we currently burn
    // one thread per background task.
    unsigned backgroundTaskMax = 0;
    char *p = getenv("LLBUILD_BACKGROUND_TASK_MAX");
    if (p && !StringRef(p).getAsInteger(10, backgroundTaskMax)) {
      // Parsed.
    } else {
      backgroundTaskMax = std::min(1024U, numLanes * 64U);
    }

    // The number of background can't exceed available concurrency.
    backgroundTaskMax = std::min(backgroundTaskMax, extraTasksMax);

    return std::make_pair(numLanes, backgroundTaskMax);
  }